

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O1

void __thiscall
datarate_test::anon_unknown_0::DatarateTestLarge::BasicRateTargetingCBRDynamicBitrateTest
          (DatarateTestLarge *this)

{
  DatarateTest *pDVar1;
  double *val1;
  uint uVar2;
  bool bVar3;
  ParamType *pPVar4;
  undefined8 *puVar5;
  pointer *__ptr;
  SEARCH_METHODS *pSVar6;
  long lVar7;
  int *piVar8;
  double dVar9;
  AssertHelper local_c8;
  AssertHelper local_c0;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 2;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x38;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.kf_min_dist = 3000;
  (this->super_DatarateTest).super_EncoderTest.cfg_.kf_max_dist = 3000;
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"desktop1.320_180.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x140,0xb4,0x1e,1,0,800);
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01044d00;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  pPVar4 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  pDVar1 = &this->super_DatarateTest;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00c7da48 +
                (long)(pPVar4->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[0x13])(pDVar1);
  uVar2 = (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  dVar9 = (double)uVar2;
  (this->super_DatarateTest).target_bitrate_update_[0] = uVar2;
  *(ulong *)((this->super_DatarateTest).target_bitrate_update_ + 1) =
       CONCAT44((int)(dVar9 * 0.7),(int)(dVar9 * 1.3));
  (this->super_DatarateTest).frame_update_bitrate_ = 0xfa;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      (*(pDVar1->super_EncoderTest)._vptr_EncoderTest[2])(pDVar1,&video);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 == false) {
      piVar8 = (this->super_DatarateTest).target_bitrate_update_;
      lVar7 = 0;
      do {
        val1 = (double *)((long)(this->super_DatarateTest).effective_datarate_dynamic_ + lVar7);
        local_c8.data_ = (AssertHelperData *)((double)*piVar8 * 0.85);
        testing::internal::CmpHelperGE<double,double>
                  ((internal *)&gtest_fatal_failure_checker,"effective_datarate_dynamic_[i]",
                   "target_bitrate_update_[i] * 0.85",val1,(double *)&local_c8);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_c8.data_)->line,
                     " The datarate for the file is lower than target by too much!",0x3c);
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            pSVar6 = "";
          }
          else {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
                     ,0xd4,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_c8.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
          puVar5 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar5 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar5 != puVar5 + 2) {
              operator_delete((undefined8 *)*puVar5);
            }
LAB_0060f474:
            operator_delete(puVar5);
          }
          break;
        }
        puVar5 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar5 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar5 != puVar5 + 2) {
            operator_delete((undefined8 *)*puVar5);
          }
          operator_delete(puVar5);
        }
        local_c8.data_ = (AssertHelperData *)((double)*piVar8 * 1.2);
        testing::internal::CmpHelperLE<double,double>
                  ((internal *)&gtest_fatal_failure_checker,"effective_datarate_dynamic_[i]",
                   "target_bitrate_update_[i] * 1.20",val1,(double *)&local_c8);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_c8.data_)->line,
                     " The datarate for the file is greater than target by too much!",0x3e);
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            pSVar6 = "";
          }
          else {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
                     ,0xd7,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (local_c8.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_c8.data_ + 8))();
          }
          puVar5 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar5 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar5 != puVar5 + 2) {
              operator_delete((undefined8 *)*puVar5);
            }
            goto LAB_0060f474;
          }
          break;
        }
        puVar5 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar5 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar5 != puVar5 + 2) {
            operator_delete((undefined8 *)*puVar5);
          }
          operator_delete(puVar5);
        }
        piVar8 = piVar8 + 1;
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x18);
      goto LAB_0060f225;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_c8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/datarate_test.cc"
             ,0xd1,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_0060f225:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

virtual void BasicRateTargetingCBRDynamicBitrateTest() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 2;
    cfg_.rc_max_quantizer = 56;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.kf_max_dist = 3000;
    cfg_.kf_min_dist = 3000;

    ::libaom_test::I420VideoSource video("desktop1.320_180.yuv", 320, 180, 30,
                                         1, 0, 800);
    const int bitrate_array[2] = { 100, 200 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    target_bitrate_update_[0] = cfg_.rc_target_bitrate;
    target_bitrate_update_[1] = static_cast<int>(1.3 * cfg_.rc_target_bitrate);
    target_bitrate_update_[2] = static_cast<int>(0.7 * cfg_.rc_target_bitrate);
    frame_update_bitrate_ = 250;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < 3; i++) {
      ASSERT_GE(effective_datarate_dynamic_[i],
                target_bitrate_update_[i] * 0.85)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_dynamic_[i],
                target_bitrate_update_[i] * 1.20)
          << " The datarate for the file is greater than target by too much!";
    }
  }